

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise1d.cpp
# Opt level: O1

int __thiscall
ncnn::DeconvolutionDepthWise1D::forward
          (DeconvolutionDepthWise1D *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  size_t sVar8;
  int *piVar9;
  void *pvVar10;
  void *pvVar11;
  bool bVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  Mat *pMVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  int iVar21;
  float *pfVar22;
  int iVar23;
  long lVar24;
  float *pfVar25;
  int iVar26;
  float *pfVar27;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  long lVar31;
  ulong uVar32;
  long lVar33;
  float *pfVar34;
  void *pvVar35;
  bool bVar36;
  float fVar37;
  int iVar40;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar41;
  float fVar42;
  int iVar43;
  int iVar46;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float *local_158;
  Mat local_148;
  Option *local_100;
  Mat *local_f8;
  ulong local_f0;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  int local_cc;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  float *local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  long local_70;
  void *local_68;
  long local_60;
  void *local_58;
  long local_50;
  ulong local_48;
  long local_40;
  float *local_38;
  
  iVar2 = bottom_blob->w;
  sVar8 = bottom_blob->elemsize;
  iVar26 = this->kernel_w;
  iVar3 = this->output_pad_right;
  iVar4 = this->dilation_w;
  iVar5 = this->stride_w;
  local_148.cstep = 0;
  local_148.data = (float *)0x0;
  local_148.refcount._0_4_ = 0;
  local_148.refcount._4_4_ = 0;
  local_148.elemsize = 0;
  local_148.elempack = 0;
  local_148.allocator = (Allocator *)0x0;
  local_148.dims = 0;
  local_148.w = 0;
  local_148.h = 0;
  local_148.d = 0;
  local_148.c = 0;
  lVar33 = 0x10;
  if ((((this->pad_left < 1) && (this->pad_right < 1)) && (this->output_w < 1)) &&
     (lVar33 = 8, &local_148 != top_blob)) {
    piVar9 = top_blob->refcount;
    if (piVar9 != (int *)0x0) {
      LOCK();
      *piVar9 = *piVar9 + 1;
      UNLOCK();
    }
    local_148.data = top_blob->data;
    local_148.refcount._0_4_ = SUB84(top_blob->refcount,0);
    local_148.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
    local_148.elemsize = top_blob->elemsize;
    local_148.elempack = top_blob->elempack;
    local_148.allocator = top_blob->allocator;
    uVar13 = top_blob->dims;
    uVar14 = top_blob->w;
    uVar15 = top_blob->h;
    uVar16 = top_blob->d;
    local_148.c = top_blob->c;
    local_148.cstep = top_blob->cstep;
    local_148.dims = uVar13;
    local_148.w = uVar14;
    local_148.h = uVar15;
    local_148.d = uVar16;
  }
  local_100 = opt;
  local_f8 = top_blob;
  Mat::create(&local_148,iVar3 + (iVar26 + -1) * iVar4 + (iVar2 + -1) * iVar5 + 1,this->num_output,
              sVar8,*(Allocator **)(&opt->lightmode + lVar33));
  iVar2 = local_148.w;
  iVar26 = -100;
  if (((float *)local_148.data != (float *)0x0) && ((long)local_148.c * local_148.cstep != 0)) {
    uVar6 = this->kernel_w;
    uVar7 = this->group;
    local_f0 = (ulong)uVar7;
    uVar30 = (ulong)(uint)local_148.w;
    pvVar10 = (this->bias_data).data;
    if (pvVar10 == (void *)0x0) {
      bVar36 = true;
    }
    else {
      bVar36 = (long)(this->bias_data).c * (this->bias_data).cstep == 0;
    }
    iVar26 = bottom_blob->w;
    lVar33 = (long)iVar26;
    iVar3 = this->stride_w;
    iVar4 = this->dilation_w;
    iVar5 = this->activation_type;
    if (local_148.h == uVar7 && bottom_blob->h == uVar7) {
      if (0 < (int)uVar7) {
        pvVar11 = bottom_blob->data;
        local_d8 = bottom_blob->elemsize * lVar33;
        pvVar35 = (this->weight_data).data;
        uVar29 = CONCAT44(0,local_148.w + 3U & 0xfffffffc);
        lVar19 = uVar30 - 1;
        auVar44._8_4_ = (int)lVar19;
        auVar44._0_8_ = lVar19;
        auVar44._12_4_ = (int)((ulong)lVar19 >> 0x20);
        pfVar34 = (float *)((long)local_148.data + 0xc);
        lVar19 = (long)local_148.w * local_148.elemsize;
        local_88._0_8_ = (long)(int)uVar6 << 2;
        uVar32 = 0;
        auVar44 = auVar44 ^ _DAT_005942f0;
        local_98._0_8_ = uVar29;
        pfVar25 = (float *)local_148.data;
        auVar45 = _DAT_005943f0;
        auVar47 = _DAT_00594400;
        auVar48 = _DAT_005942f0;
        local_c8 = auVar44;
        do {
          fVar37 = 0.0;
          if (!bVar36) {
            fVar37 = *(float *)((long)pvVar10 + uVar32 * 4);
          }
          if (0 < iVar2) {
            uVar20 = 0;
            do {
              auVar39._8_4_ = (int)uVar20;
              auVar39._0_8_ = uVar20;
              auVar39._12_4_ = (int)(uVar20 >> 0x20);
              auVar38 = (auVar39 | auVar47) ^ auVar48;
              iVar21 = auVar44._0_4_;
              bVar12 = iVar21 < auVar38._0_4_;
              iVar23 = auVar38._4_4_;
              iVar40 = auVar44._4_4_;
              if ((bool)(~(iVar40 < iVar23 || iVar23 == iVar40 && bVar12) & 1)) {
                pfVar34[uVar20 - 3] = fVar37;
              }
              if (iVar40 >= iVar23 && (iVar23 != iVar40 || !bVar12)) {
                pfVar34[uVar20 - 2] = fVar37;
              }
              auVar38 = (auVar39 | auVar45) ^ auVar48;
              iVar23 = auVar38._4_4_;
              if (iVar23 <= iVar40 && (iVar23 != iVar40 || auVar38._0_4_ <= iVar21)) {
                pfVar34[uVar20 - 1] = fVar37;
                pfVar34[uVar20] = fVar37;
              }
              uVar20 = uVar20 + 4;
            } while (uVar29 != uVar20);
          }
          if (0 < iVar26) {
            lVar24 = 0;
            pfVar22 = pfVar25;
            do {
              if (0 < (int)uVar6) {
                fVar37 = *(float *)((long)pvVar11 + lVar24 * 4 + local_d8 * uVar32);
                uVar29 = 0;
                pfVar27 = pfVar22;
                do {
                  *pfVar27 = *(float *)((long)pvVar35 + uVar29 * 4) * fVar37 + *pfVar27;
                  uVar29 = uVar29 + 1;
                  pfVar27 = pfVar27 + iVar4;
                } while (uVar6 != uVar29);
              }
              lVar24 = lVar24 + 1;
              pfVar22 = pfVar22 + iVar3;
            } while (lVar24 != lVar33);
          }
          if (0 < iVar2) {
            pfVar22 = (float *)(this->activation_params).data;
            uVar29 = 0;
            do {
              fVar37 = pfVar25[uVar29];
              fVar42 = fVar37;
              switch(iVar5) {
              case 1:
                if (fVar37 <= 0.0) {
                  fVar42 = 0.0;
                }
                break;
              case 2:
                fVar42 = (float)(~-(uint)(0.0 < fVar37) & (uint)*pfVar22 |
                                -(uint)(0.0 < fVar37) & 0x3f800000) * fVar37;
                break;
              case 3:
                if (fVar37 <= *pfVar22) {
                  fVar37 = *pfVar22;
                }
                fVar42 = pfVar22[1];
                if (fVar37 <= pfVar22[1]) {
                  fVar42 = fVar37;
                }
                break;
              case 4:
                if (88.37626 <= fVar37) {
                  fVar37 = 88.37626;
                }
                fVar37 = expf((float)(-(uint)(fVar37 < -88.37626) & 0x42b0c0a5 |
                                     ~-(uint)(fVar37 < -88.37626) & ((uint)fVar37 ^ auVar48._0_4_)))
                ;
                auVar44 = local_c8;
                auVar45 = _DAT_005943f0;
                auVar47 = _DAT_00594400;
                auVar48 = _DAT_005942f0;
                fVar42 = 1.0 / (fVar37 + 1.0);
                break;
              case 5:
                local_b8 = ZEXT416((uint)fVar37);
                fVar37 = expf(fVar37);
                fVar37 = logf(fVar37 + 1.0);
                fVar37 = tanhf(fVar37);
                auVar44 = local_c8;
                auVar45 = _DAT_005943f0;
                auVar47 = _DAT_00594400;
                auVar48 = _DAT_005942f0;
                fVar42 = fVar37 * (float)local_b8._0_4_;
                break;
              case 6:
                fVar1 = *pfVar22;
                fVar41 = (float)((uint)pfVar22[1] ^ auVar48._0_4_) / fVar1;
                fVar42 = 0.0;
                if ((fVar41 <= fVar37) && (fVar42 = fVar37, fVar37 <= fVar41 + 1.0 / fVar1)) {
                  fVar42 = (fVar1 * fVar37 + pfVar22[1]) * fVar37;
                }
              }
              pfVar25[uVar29] = fVar42;
              uVar29 = uVar29 + 1;
            } while (uVar30 != uVar29);
          }
          uVar32 = uVar32 + 1;
          pfVar34 = (float *)((long)pfVar34 + lVar19);
          pfVar25 = (float *)((long)pfVar25 + lVar19);
          pvVar35 = (void *)((long)pvVar35 + local_88._0_8_);
          uVar29 = local_98._0_8_;
        } while (uVar32 != local_f0);
      }
    }
    else {
      uVar18 = bottom_blob->h / (int)uVar7;
      if (0 < (int)uVar7) {
        lVar24 = (long)local_148.h;
        local_68 = (this->weight_data).data;
        iVar23 = (int)(lVar24 / (long)(int)uVar7);
        local_70 = (long)iVar23;
        local_48 = (ulong)(local_148.w + 3U & 0xfffffffc);
        lVar19 = uVar30 - 1;
        auVar45._8_4_ = (int)lVar19;
        auVar45._0_8_ = lVar19;
        auVar45._12_4_ = (int)((ulong)lVar19 >> 0x20);
        lVar19 = (long)local_148.w * local_148.elemsize;
        local_a0 = (float *)((long)local_148.data + 0xc);
        local_60 = lVar19 * local_70;
        local_cc = iVar23 * uVar6 * uVar18;
        local_40 = (long)(int)(uVar18 * uVar6) << 2;
        local_e0 = 0;
        auVar45 = auVar45 ^ _DAT_005942f0;
        local_e8 = 0;
        pfVar34 = (float *)local_148.data;
        auVar44 = _DAT_005943f0;
        auVar47 = _DAT_00594400;
        auVar48 = _DAT_005942f0;
        local_98 = auVar45;
        do {
          pfVar25 = pfVar34;
          if (0 < iVar23) {
            local_c8._0_8_ = (void *)((long)local_68 + (long)(int)local_e0 * 4);
            local_50 = local_e8 * local_70;
            local_58 = (this->bias_data).data;
            iVar21 = (int)local_e8;
            local_158 = local_a0;
            uVar29 = 0;
            local_38 = pfVar34;
            do {
              fVar37 = 0.0;
              if (!bVar36) {
                fVar37 = *(float *)((long)local_58 + (local_50 + uVar29) * 4);
              }
              if (0 < iVar2) {
                uVar32 = 0;
                do {
                  auVar38._8_4_ = (int)uVar32;
                  auVar38._0_8_ = uVar32;
                  auVar38._12_4_ = (int)(uVar32 >> 0x20);
                  auVar39 = (auVar38 | auVar47) ^ auVar48;
                  iVar43 = auVar45._0_4_;
                  bVar12 = iVar43 < auVar39._0_4_;
                  iVar40 = auVar39._4_4_;
                  iVar46 = auVar45._4_4_;
                  if ((bool)(~(iVar46 < iVar40 || iVar40 == iVar46 && bVar12) & 1)) {
                    local_158[uVar32 - 3] = fVar37;
                  }
                  if (iVar46 >= iVar40 && (iVar40 != iVar46 || !bVar12)) {
                    local_158[uVar32 - 2] = fVar37;
                  }
                  auVar38 = (auVar38 | auVar44) ^ auVar48;
                  iVar40 = auVar38._4_4_;
                  if (iVar40 <= iVar46 && (iVar40 != iVar46 || auVar38._0_4_ <= iVar43)) {
                    local_158[uVar32 - 1] = fVar37;
                    local_158[uVar32] = fVar37;
                  }
                  uVar32 = uVar32 + 4;
                } while (local_48 != uVar32);
              }
              if (0 < iVar26) {
                pvVar10 = bottom_blob->data;
                iVar40 = bottom_blob->w;
                sVar8 = bottom_blob->elemsize;
                lVar28 = 0;
                pfVar25 = pfVar34;
                do {
                  if (0 < (int)uVar18) {
                    uVar32 = 0;
                    lVar31 = local_c8._0_8_;
                    do {
                      if (0 < (int)uVar6) {
                        fVar37 = *(float *)((long)pvVar10 +
                                           (uVar32 + uVar18 * iVar21) * (long)iVar40 * sVar8 +
                                           lVar28 * 4);
                        uVar20 = 0;
                        pfVar22 = pfVar25;
                        do {
                          *pfVar22 = *(float *)(lVar31 + uVar20 * 4) * fVar37 + *pfVar22;
                          uVar20 = uVar20 + 1;
                          pfVar22 = pfVar22 + iVar4;
                        } while (uVar6 != uVar20);
                      }
                      uVar32 = uVar32 + 1;
                      lVar31 = lVar31 + (long)(int)uVar6 * 4;
                    } while (uVar32 != uVar18);
                  }
                  lVar28 = lVar28 + 1;
                  pfVar25 = pfVar25 + iVar3;
                } while (lVar28 != lVar33);
              }
              local_d8 = uVar29;
              if (0 < iVar2) {
                local_b8._0_8_ = (this->activation_params).data;
                uVar29 = 0;
                do {
                  fVar37 = pfVar34[uVar29];
                  fVar42 = fVar37;
                  switch(iVar5) {
                  case 1:
                    if (fVar37 <= 0.0) {
                      fVar42 = 0.0;
                    }
                    break;
                  case 2:
                    fVar42 = (float)(~-(uint)(0.0 < fVar37) & (uint)*(float *)local_b8._0_8_ |
                                    -(uint)(0.0 < fVar37) & 0x3f800000) * fVar37;
                    break;
                  case 3:
                    if (fVar37 <= *(float *)local_b8._0_8_) {
                      fVar37 = *(float *)local_b8._0_8_;
                    }
                    fVar42 = *(float *)(local_b8._0_8_ + 4);
                    if (fVar37 <= *(float *)(local_b8._0_8_ + 4)) {
                      fVar42 = fVar37;
                    }
                    break;
                  case 4:
                    if (88.37626 <= fVar37) {
                      fVar37 = 88.37626;
                    }
                    fVar37 = expf((float)(-(uint)(fVar37 < -88.37626) & 0x42b0c0a5 |
                                         ~-(uint)(fVar37 < -88.37626) &
                                         ((uint)fVar37 ^ auVar48._0_4_)));
                    auVar45 = local_98;
                    auVar44 = _DAT_005943f0;
                    auVar47 = _DAT_00594400;
                    auVar48 = _DAT_005942f0;
                    fVar42 = 1.0 / (fVar37 + 1.0);
                    break;
                  case 5:
                    local_88 = ZEXT416((uint)fVar37);
                    fVar37 = expf(fVar37);
                    fVar37 = logf(fVar37 + 1.0);
                    fVar37 = tanhf(fVar37);
                    auVar45 = local_98;
                    auVar44 = _DAT_005943f0;
                    auVar47 = _DAT_00594400;
                    auVar48 = _DAT_005942f0;
                    fVar42 = fVar37 * (float)local_88._0_4_;
                    break;
                  case 6:
                    fVar1 = *(float *)local_b8._0_8_;
                    fVar41 = (float)((uint)*(float *)(local_b8._0_8_ + 4) ^ auVar48._0_4_) / fVar1;
                    fVar42 = 0.0;
                    if ((fVar41 <= fVar37) && (fVar42 = fVar37, fVar37 <= fVar41 + 1.0 / fVar1)) {
                      fVar42 = (fVar1 * fVar37 + *(float *)(local_b8._0_8_ + 4)) * fVar37;
                    }
                  }
                  pfVar34[uVar29] = fVar42;
                  uVar29 = uVar29 + 1;
                } while (uVar30 != uVar29);
              }
              uVar29 = local_d8 + 1;
              local_158 = (float *)((long)local_158 + lVar19);
              pfVar34 = (float *)((long)pfVar34 + lVar19);
              local_c8._0_8_ = local_c8._0_8_ + local_40;
              pfVar25 = local_38;
            } while (uVar29 != (lVar24 / (long)(int)uVar7 & 0xffffffffU));
          }
          local_e8 = local_e8 + 1;
          local_a0 = (float *)((long)local_a0 + local_60);
          pfVar34 = (float *)((long)pfVar25 + local_60);
          local_e0 = (ulong)(uint)((int)local_e0 + local_cc);
        } while (local_e8 != local_f0);
      }
    }
    pMVar17 = local_f8;
    cut_padding(this,&local_148,local_f8,local_100);
    iVar26 = -100;
    if ((pMVar17->data != (void *)0x0) && (iVar26 = -100, (long)pMVar17->c * pMVar17->cstep != 0)) {
      iVar26 = 0;
    }
  }
  piVar9 = (int *)CONCAT44(local_148.refcount._4_4_,local_148.refcount._0_4_);
  if (piVar9 != (int *)0x0) {
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (*piVar9 == 0) {
      if (local_148.allocator == (Allocator *)0x0) {
        if ((float *)local_148.data != (float *)0x0) {
          free(local_148.data);
        }
      }
      else {
        (*(local_148.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar26;
}

Assistant:

int DeconvolutionDepthWise1D::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || output_w > 0)
    {
        top_blob_bordered.create(outw, num_output, elemsize, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, num_output, elemsize, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    int ret = deconvolutiondepthwise1d(bottom_blob, top_blob_bordered, weight_data, bias_data, kernel_w, stride_w, dilation_w, group, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}